

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_dc_top_predictor_64x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  undefined1 (*pauVar2) [32];
  bool bVar3;
  undefined1 auVar4 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [32];
  
  auVar4 = in_ZMM0._0_32_;
  dc_sum_64(above);
  auVar5._8_2_ = 0x20;
  auVar5._0_8_ = 0x20002000200020;
  auVar5._10_2_ = 0x20;
  auVar5._12_2_ = 0x20;
  auVar5._14_2_ = 0x20;
  auVar5._16_2_ = 0x20;
  auVar5._18_2_ = 0x20;
  auVar5._20_2_ = 0x20;
  auVar5._22_2_ = 0x20;
  auVar5._24_2_ = 0x20;
  auVar5._26_2_ = 0x20;
  auVar5._28_2_ = 0x20;
  auVar5._30_2_ = 0x20;
  auVar4 = vpaddw_avx2(auVar4,auVar5);
  auVar4 = vpsrlw_avx2(auVar4,6);
  auVar4 = vpshufb_avx2(auVar4,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  pauVar2 = (undefined1 (*) [32])(dst + 0x20);
  iVar1 = 0x40;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    pauVar2[-1] = auVar4;
    *pauVar2 = auVar4;
    pauVar2 = (undefined1 (*) [32])(*pauVar2 + stride);
  }
  return;
}

Assistant:

void aom_dc_top_predictor_64x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m256i sum = dc_sum_64(above);
  (void)left;

  const __m256i thirtytwo = _mm256_set1_epi16(32);
  sum = _mm256_add_epi16(sum, thirtytwo);
  sum = _mm256_srai_epi16(sum, 6);
  const __m256i zero = _mm256_setzero_si256();
  __m256i row = _mm256_shuffle_epi8(sum, zero);
  row_store_64xh(&row, 64, dst, stride);
}